

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void wallet::ErrorLogCallback(void *arg,int code,char *msg)

{
  long lVar1;
  string_view source_file;
  long in_RDI;
  long in_FS_OFFSET;
  LogFlags unaff_retaddr;
  int in_stack_0000000c;
  ConstevalFormatString<2U> in_stack_00000048;
  undefined4 in_stack_00000058;
  undefined1 in_stack_00000060 [16];
  Level in_stack_00000140;
  int *in_stack_00000150;
  char **in_stack_00000158;
  char *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI != 0) {
    __assert_fail("arg == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                  ,0x2a,"void wallet::ErrorLogCallback(void *, int, const char *)");
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  source_file._M_str._0_4_ = in_stack_00000058;
  source_file._M_len = (size_t)msg;
  source_file._M_str._4_4_ = code;
  LogPrintFormatInternal<int,char_const*>
            ((string_view)in_stack_00000060,source_file,in_stack_0000000c,unaff_retaddr,
             in_stack_00000140,in_stack_00000048,in_stack_00000150,in_stack_00000158);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ErrorLogCallback(void* arg, int code, const char* msg)
{
    // From sqlite3_config() documentation for the SQLITE_CONFIG_LOG option:
    // "The void pointer that is the second argument to SQLITE_CONFIG_LOG is passed through as
    // the first parameter to the application-defined logger function whenever that function is
    // invoked."
    // Assert that this is the case:
    assert(arg == nullptr);
    LogPrintf("SQLite Error. Code: %d. Message: %s\n", code, msg);
}